

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O3

void __thiscall EventQueue::Remove(EventQueue *this,Event *ev)

{
  iterator iVar1;
  iterator i;
  AutoLock _auto_lock_;
  iterator local_40;
  AutoLock local_38;
  
  AutoLock::AutoLock(&local_38,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0x92);
  iVar1.mNode = ((this->mQueue).mHead)->next;
  if (iVar1.mNode != (this->mQueue).mTail) {
    do {
      if ((iVar1.mNode)->val == ev) {
        RefCount::Release(&(iVar1.mNode)->val->super_RefCount);
        JetHead::list<Event_*>::iterator::erase(&local_40);
        iVar1.mNode = local_40.mNode;
        if (local_40.mNode != (Node *)0x0) {
          iVar1.mNode = (local_40.mNode)->prev;
          if (iVar1.mNode != (Node *)0x0) goto LAB_00116fd1;
          iVar1.mNode = (Node *)0x0;
        }
      }
      else {
LAB_00116fd1:
        iVar1.mNode = (iVar1.mNode)->next;
      }
    } while (iVar1.mNode != (this->mQueue).mTail);
  }
  AutoLock::~AutoLock(&local_38);
  return;
}

Assistant:

void EventQueue::Remove( Event *ev )
{
	DebugAutoLock( mLock );

	for (JetHead::list<Event*>::iterator i = mQueue.begin(); i != mQueue.end(); ++i)
	{
		if ((*i) == ev)
		{
			(*i)->Release();
			i = i.erase();
			--i;
		}
	}	
}